

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::MulDivOp> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::MulDivOp>(RecursiveDescentParser *this)

{
  element_type *peVar1;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::MulDivOp> sVar2;
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::MulDivOp> *pResult;
  
  std::make_shared<MyCompiler::MulDivOp>();
  if (in_RSI->sym == TIMES) {
    peVar1 = std::
             __shared_ptr_access<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::__cxx11::string::operator=((string *)&(peVar1->super_AbstractAstNode).value,"*");
    __addr = extraout_RDX;
  }
  else {
    peVar1 = std::
             __shared_ptr_access<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::__cxx11::string::operator=((string *)&(peVar1->super_AbstractAstNode).value,"/");
    __addr = extraout_RDX_00;
  }
  accept(in_RSI,in_RSI->sym,__addr,in_RCX);
  sVar2.super___shared_ptr<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX_01._M_pi;
  sVar2.super___shared_ptr<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::MulDivOp>)
         sVar2.super___shared_ptr<MyCompiler::MulDivOp,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::MulDivOp> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<MulDivOp>();

    switch (sym)
    {
        case SymbolType::TIMES:
            pResult->value = "*";
            break;
        default: // case SymbolType::SLASH:
            pResult->value = "/";
    }
    accept(sym);

    return pResult;
}